

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

Status __thiscall leveldb::RecoveryTest::OpenWithStatus(RecoveryTest *this,Options *options)

{
  long lVar1;
  undefined8 *in_RDX;
  Options *pOVar2;
  byte bVar3;
  Options opts;
  
  bVar3 = 0;
  Close((RecoveryTest *)options);
  Options::Options(&opts);
  if (in_RDX == (undefined8 *)0x0) {
    opts.reuse_logs = true;
    opts.create_if_missing = true;
  }
  else {
    pOVar2 = &opts;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar2->comparator = *in_RDX;
      in_RDX = in_RDX + (ulong)bVar3 * -2 + 1;
      pOVar2 = (Options *)((long)pOVar2 + ((ulong)bVar3 * -2 + 1) * 8);
    }
  }
  if (opts.env == (Env *)0x0) {
    opts.env = (Env *)options->block_cache;
  }
  DB::Open((DB *)this,&opts,(string *)&options->env,(DB **)&options->block_size);
  return (Status)(char *)this;
}

Assistant:

Status OpenWithStatus(Options* options = nullptr) {
    Close();
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts.reuse_logs = true;  // TODO(sanjay): test both ways
      opts.create_if_missing = true;
    }
    if (opts.env == nullptr) {
      opts.env = env_;
    }
    return DB::Open(opts, dbname_, &db_);
  }